

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

Totals * __thiscall
Catch::RunContext::runTest(Totals *__return_storage_ptr__,RunContext *this,TestCase *testCase)

{
  Option<Catch::SectionTracking::TestCaseTracker> *this_00;
  long *plVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  IStreamingReporter *pIVar6;
  int iVar7;
  IMutableContext *pIVar8;
  size_t sVar9;
  long lVar10;
  size_t sVar11;
  string redirectedCerr;
  string redirectedCout;
  TestCaseInfo testInfo;
  string local_328;
  string local_308;
  size_t local_2e8;
  size_t sStack_2e0;
  TestCaseInfo local_2d0;
  undefined1 local_1c0 [48];
  undefined1 local_190 [24];
  _Alloc_hider local_178;
  undefined1 local_170 [16];
  undefined8 local_160;
  bool local_158;
  
  sVar2 = (this->m_totals).assertions.passed;
  sVar3 = (this->m_totals).assertions.failed;
  sVar4 = (this->m_totals).assertions.failedButOk;
  local_2e8 = (this->m_totals).testCases.passed;
  sStack_2e0 = (this->m_totals).testCases.failed;
  sVar5 = (this->m_totals).testCases.failedButOk;
  local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
  local_308._M_string_length = 0;
  local_308.field_2._M_local_buf[0] = '\0';
  local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
  local_328._M_string_length = 0;
  local_328.field_2._M_local_buf[0] = '\0';
  TestCaseInfo::TestCaseInfo(&local_2d0,&testCase->super_TestCaseInfo);
  pIVar6 = (this->m_reporter).m_p;
  (*(pIVar6->super_IShared).super_NonCopyable._vptr_NonCopyable[8])(pIVar6,&local_2d0);
  this->m_activeTestCase = testCase;
  local_1c0._0_8_ = local_1c0 + 0x10;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1c0,local_2d0.name._M_dataplus._M_p,
             local_2d0.name._M_dataplus._M_p + local_2d0.name._M_string_length);
  local_190._16_8_ = local_190;
  local_1c0._32_4_ = NotStarted;
  local_190._0_4_ = _S_red;
  local_190._8_8_ = (_Base_ptr)0x0;
  local_170 = (undefined1  [16])0x0;
  local_158 = false;
  this_00 = &this->m_testCaseTracker;
  local_178._M_p = (pointer)local_190._16_8_;
  local_160 = (TestCaseTracker *)local_1c0;
  Option<Catch::SectionTracking::TestCaseTracker>::operator=(this_00,(TestCaseTracker *)local_1c0);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::SectionTracking::TrackedSection>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::SectionTracking::TrackedSection>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::SectionTracking::TrackedSection>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::SectionTracking::TrackedSection>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::SectionTracking::TrackedSection>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::SectionTracking::TrackedSection>_>_>
               *)(local_1c0 + 0x28));
  if ((undefined1 *)local_1c0._0_8_ != local_1c0 + 0x10) {
    operator_delete((void *)local_1c0._0_8_);
  }
LAB_00148ca6:
  do {
    runCurrentTest(this,&local_308,&local_328);
    if ((this_00->nullableValue->m_testCase).m_runState != Completed) {
      iVar7 = (*(this->super_IResultCapture)._vptr_IResultCapture[9])(this);
      if ((char)iVar7 == '\0') goto LAB_00148ca6;
    }
    pIVar8 = getCurrentMutableContext();
    iVar7 = (*(pIVar8->super_IContext)._vptr_IContext[5])(pIVar8);
    if ((char)iVar7 == '\0') goto LAB_00148ce9;
    iVar7 = (*(this->super_IResultCapture)._vptr_IResultCapture[9])(this);
    if ((char)iVar7 != '\0') {
LAB_00148ce9:
      sVar9 = (this->m_totals).assertions.failed;
      sVar11 = (this->m_totals).assertions.failedButOk;
      (__return_storage_ptr__->assertions).passed = (this->m_totals).assertions.passed - sVar2;
      sVar11 = sVar11 - sVar4;
      sVar9 = sVar9 - sVar3;
      (__return_storage_ptr__->assertions).failed = sVar9;
      (__return_storage_ptr__->assertions).failedButOk = sVar11;
      lVar10 = 0x20;
      if (sVar9 == 0) {
        lVar10 = (ulong)(sVar11 != 0) * 0x10 + 0x18;
      }
      sVar2 = (this->m_totals).testCases.failedButOk;
      sVar3 = (this->m_totals).testCases.passed;
      sVar4 = (this->m_totals).testCases.failed;
      (__return_storage_ptr__->testCases).passed = sVar3 - local_2e8;
      (__return_storage_ptr__->testCases).failed = sVar4 - sStack_2e0;
      (__return_storage_ptr__->testCases).failedButOk = sVar2 - sVar5;
      plVar1 = (long *)((long)&(__return_storage_ptr__->assertions).passed + lVar10);
      *plVar1 = *plVar1 + 1;
      sVar5 = (__return_storage_ptr__->testCases).failed;
      (this->m_totals).testCases.passed = (__return_storage_ptr__->testCases).passed + sVar3;
      (this->m_totals).testCases.failed = sVar5 + sVar4;
      (this->m_totals).testCases.failedButOk =
           sVar2 + (__return_storage_ptr__->testCases).failedButOk;
      pIVar6 = (this->m_reporter).m_p;
      iVar7 = (*(this->super_IResultCapture)._vptr_IResultCapture[9])(this);
      TestCaseStats::TestCaseStats
                ((TestCaseStats *)local_1c0,&local_2d0,__return_storage_ptr__,&local_308,&local_328,
                 SUB41(iVar7,0));
      (*(pIVar6->super_IShared).super_NonCopyable._vptr_NonCopyable[0xd])(pIVar6,local_1c0);
      TestCaseStats::~TestCaseStats((TestCaseStats *)local_1c0);
      this->m_activeTestCase = (TestCase *)0x0;
      Option<Catch::SectionTracking::TestCaseTracker>::reset(this_00);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d0.lineInfo.file._M_dataplus._M_p != &local_2d0.lineInfo.file.field_2) {
        operator_delete(local_2d0.lineInfo.file._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d0.tagsAsString._M_dataplus._M_p != &local_2d0.tagsAsString.field_2) {
        operator_delete(local_2d0.tagsAsString._M_dataplus._M_p);
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree(&local_2d0.lcaseTags._M_t);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree(&local_2d0.tags._M_t);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d0.description._M_dataplus._M_p != &local_2d0.description.field_2) {
        operator_delete(local_2d0.description._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d0.className._M_dataplus._M_p != &local_2d0.className.field_2) {
        operator_delete(local_2d0.className._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d0.name._M_dataplus._M_p != &local_2d0.name.field_2) {
        operator_delete(local_2d0.name._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_328._M_dataplus._M_p != &local_328.field_2) {
        operator_delete(local_328._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_308._M_dataplus._M_p != &local_308.field_2) {
        operator_delete(local_308._M_dataplus._M_p);
      }
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

Totals runTest( TestCase const& testCase ) {
            Totals prevTotals = m_totals;

            std::string redirectedCout;
            std::string redirectedCerr;

            TestCaseInfo testInfo = testCase.getTestCaseInfo();

            m_reporter->testCaseStarting( testInfo );

            m_activeTestCase = &testCase;
            m_testCaseTracker = TestCaseTracker( testInfo.name );

            do {
                do {
                    runCurrentTest( redirectedCout, redirectedCerr );
                }
                while( !m_testCaseTracker->isCompleted() && !aborting() );
            }
            while( getCurrentContext().advanceGeneratorsForCurrentTest() && !aborting() );

            Totals deltaTotals = m_totals.delta( prevTotals );
            m_totals.testCases += deltaTotals.testCases;
            m_reporter->testCaseEnded( TestCaseStats(   testInfo,
                                                        deltaTotals,
                                                        redirectedCout,
                                                        redirectedCerr,
                                                        aborting() ) );

            m_activeTestCase = NULL;
            m_testCaseTracker.reset();

            return deltaTotals;
        }